

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::_ResetForNewFrame(ImDrawList *this)

{
  ImDrawCmd *pIVar1;
  unsigned_short *__src;
  ImDrawVert *__src_00;
  ImVec4 *__src_01;
  void **__src_02;
  ImVec2 *__src_03;
  ImDrawCmd *pIVar2;
  unsigned_short *__dest;
  ImDrawVert *__dest_00;
  ImVec4 *__dest_01;
  void **__dest_02;
  ImVec2 *__dest_03;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  if (1 < (this->_Splitter)._Count) {
    ImDrawListSplitter::Merge(&this->_Splitter,this);
  }
  iVar4 = (this->CmdBuffer).Capacity;
  if (iVar4 < 0) {
    uVar3 = iVar4 / 2 + iVar4;
    uVar7 = 0;
    if (0 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    pIVar2 = (ImDrawCmd *)ImGui::MemAlloc(uVar7 * 0x38);
    pIVar1 = (this->CmdBuffer).Data;
    if (pIVar1 != (ImDrawCmd *)0x0) {
      memcpy(pIVar2,pIVar1,(long)(this->CmdBuffer).Size * 0x38);
      ImGui::MemFree((this->CmdBuffer).Data);
    }
    (this->CmdBuffer).Data = pIVar2;
    (this->CmdBuffer).Capacity = (int)uVar7;
  }
  (this->CmdBuffer).Size = 0;
  iVar4 = (this->IdxBuffer).Capacity;
  if (iVar4 < 0) {
    iVar4 = iVar4 / 2 + iVar4;
    iVar6 = 0;
    if (0 < iVar4) {
      iVar6 = iVar4;
    }
    __dest = (unsigned_short *)ImGui::MemAlloc((ulong)(uint)(iVar6 * 2));
    __src = (this->IdxBuffer).Data;
    if (__src != (unsigned_short *)0x0) {
      memcpy(__dest,__src,(long)(this->IdxBuffer).Size * 2);
      ImGui::MemFree((this->IdxBuffer).Data);
    }
    (this->IdxBuffer).Data = __dest;
    (this->IdxBuffer).Capacity = iVar6;
  }
  (this->IdxBuffer).Size = 0;
  iVar4 = (this->VtxBuffer).Capacity;
  if (iVar4 < 0) {
    uVar3 = iVar4 / 2 + iVar4;
    uVar7 = 0;
    if (0 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    __dest_00 = (ImDrawVert *)ImGui::MemAlloc(uVar7 * 0x14);
    __src_00 = (this->VtxBuffer).Data;
    if (__src_00 != (ImDrawVert *)0x0) {
      memcpy(__dest_00,__src_00,(long)(this->VtxBuffer).Size * 0x14);
      ImGui::MemFree((this->VtxBuffer).Data);
    }
    (this->VtxBuffer).Data = __dest_00;
    (this->VtxBuffer).Capacity = (int)uVar7;
  }
  uVar7 = 0;
  (this->VtxBuffer).Size = 0;
  this->Flags = this->_Data->InitialFlags;
  (this->_CmdHeader).ClipRect.x = 0.0;
  (this->_CmdHeader).ClipRect.y = 0.0;
  (this->_CmdHeader).ClipRect.z = 0.0;
  (this->_CmdHeader).ClipRect.w = 0.0;
  (this->_CmdHeader).TextureId = (ImTextureID)0x0;
  *(undefined8 *)&(this->_CmdHeader).VtxOffset = 0;
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  iVar4 = (this->_ClipRectStack).Capacity;
  if (iVar4 < 0) {
    uVar3 = iVar4 / 2 + iVar4;
    if (0 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    __dest_01 = (ImVec4 *)ImGui::MemAlloc(uVar7 << 4);
    __src_01 = (this->_ClipRectStack).Data;
    if (__src_01 != (ImVec4 *)0x0) {
      memcpy(__dest_01,__src_01,(long)(this->_ClipRectStack).Size << 4);
      ImGui::MemFree((this->_ClipRectStack).Data);
    }
    (this->_ClipRectStack).Data = __dest_01;
    (this->_ClipRectStack).Capacity = (int)uVar7;
  }
  (this->_ClipRectStack).Size = 0;
  iVar4 = (this->_TextureIdStack).Capacity;
  if (iVar4 < 0) {
    uVar3 = iVar4 / 2 + iVar4;
    uVar7 = 0;
    if (0 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    __dest_02 = (void **)ImGui::MemAlloc(uVar7 * 8);
    __src_02 = (this->_TextureIdStack).Data;
    if (__src_02 != (void **)0x0) {
      memcpy(__dest_02,__src_02,(long)(this->_TextureIdStack).Size << 3);
      ImGui::MemFree((this->_TextureIdStack).Data);
    }
    (this->_TextureIdStack).Data = __dest_02;
    (this->_TextureIdStack).Capacity = (int)uVar7;
  }
  (this->_TextureIdStack).Size = 0;
  iVar4 = (this->_Path).Capacity;
  if (iVar4 < 0) {
    uVar3 = iVar4 / 2 + iVar4;
    uVar7 = 0;
    if (0 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    __dest_03 = (ImVec2 *)ImGui::MemAlloc(uVar7 * 8);
    __src_03 = (this->_Path).Data;
    if (__src_03 != (ImVec2 *)0x0) {
      memcpy(__dest_03,__src_03,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = __dest_03;
    (this->_Path).Capacity = (int)uVar7;
  }
  (this->_Path).Size = 0;
  (this->_Splitter)._Current = 0;
  (this->_Splitter)._Count = 1;
  iVar4 = (this->CmdBuffer).Size;
  iVar6 = (this->CmdBuffer).Capacity;
  if (iVar4 == iVar6) {
    iVar4 = iVar4 + 1;
    if (iVar6 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar6 / 2 + iVar6;
    }
    if (iVar4 < iVar5) {
      iVar4 = iVar5;
    }
    if (iVar6 < iVar4) {
      pIVar2 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar4 * 0x38);
      pIVar1 = (this->CmdBuffer).Data;
      if (pIVar1 != (ImDrawCmd *)0x0) {
        memcpy(pIVar2,pIVar1,(long)(this->CmdBuffer).Size * 0x38);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = pIVar2;
      (this->CmdBuffer).Capacity = iVar4;
    }
  }
  pIVar2 = (this->CmdBuffer).Data;
  iVar4 = (this->CmdBuffer).Size;
  *(undefined8 *)&pIVar2[iVar4].ElemCount = 0;
  *(ImDrawCallback *)(&pIVar2[iVar4].ElemCount + 2) = (ImDrawCallback)0x0;
  pIVar2[iVar4].TextureId = (ImTextureID)0x0;
  (&pIVar2[iVar4].TextureId)[1] = (ImTextureID)0x0;
  pIVar1 = pIVar2 + iVar4;
  (pIVar1->ClipRect).x = 0.0;
  (pIVar1->ClipRect).y = 0.0;
  (pIVar1->ClipRect).z = 0.0;
  (pIVar1->ClipRect).w = 0.0;
  pIVar2[iVar4].UserCallbackData = (void *)0x0;
  (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
  this->_FringeScale = 1.0;
  return;
}

Assistant:

void ImDrawList::_ResetForNewFrame()
{
    // Verify that the ImDrawCmd fields we want to memcmp() are contiguous in memory.
    IM_STATIC_ASSERT(IM_OFFSETOF(ImDrawCmd, ClipRect) == 0);
    IM_STATIC_ASSERT(IM_OFFSETOF(ImDrawCmd, TextureId) == sizeof(ImVec4));
    IM_STATIC_ASSERT(IM_OFFSETOF(ImDrawCmd, VtxOffset) == sizeof(ImVec4) + sizeof(ImTextureID));
    if (_Splitter._Count > 1)
        _Splitter.Merge(this);

    CmdBuffer.resize(0);
    IdxBuffer.resize(0);
    VtxBuffer.resize(0);
    Flags = _Data->InitialFlags;
    memset(&_CmdHeader, 0, sizeof(_CmdHeader));
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.resize(0);
    _TextureIdStack.resize(0);
    _Path.resize(0);
    _Splitter.Clear();
    CmdBuffer.push_back(ImDrawCmd());
    _FringeScale = 1.0f;
}